

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O3

uint64_t __thiscall pbrt::ZSobolSampler::GetSampleIndex(ZSobolSampler *this)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar3 = (ulong)(uint)this->nBase4Digits;
  uVar1 = this->mortonIndex;
  uVar2 = this->log2SamplesPerPixel & 1;
  if ((int)uVar2 < this->nBase4Digits) {
    uVar4 = uVar3 * 2;
    uVar5 = 0;
    do {
      uVar6 = uVar4 & 0x3f;
      uVar4 = uVar4 - 2;
      uVar3 = uVar3 - 1;
      uVar6 = uVar1 >> uVar6 ^ (long)this->dimension * 0x55555555;
      uVar6 = (uVar6 >> 0x1f ^ uVar6) * 0x7fb5d329728ea185;
      lVar7 = (uVar6 >> 0x1b ^ uVar6) * -0x7e25210b43d22bb3;
      uVar5 = uVar5 | (ulong)GetSampleIndex::permutations[0]
                             [(ulong)((uint)(uVar1 >> (uVar4 & 0x3f)) & 3) +
                              (ulong)(((uint)((ulong)lVar7 >> 0x39) ^ (uint)((ulong)lVar7 >> 0x18))
                                      % 0x18 << 2)] << (uVar4 & 0x3f);
    } while ((long)(ulong)uVar2 < (long)uVar3);
  }
  else {
    uVar5 = 0;
  }
  uVar1 = ((uint)uVar1 & 2 | uVar5) >> 1;
  if (uVar2 == 0) {
    uVar1 = uVar5;
  }
  return uVar1;
}

Assistant:

PBRT_CPU_GPU
    uint64_t GetSampleIndex() const {
        static const uint8_t permutations[24][4] = {
            {0, 1, 2, 3}, {0, 1, 3, 2}, {0, 2, 1, 3}, {0, 2, 3, 1}, {0, 3, 2, 1},
            {0, 3, 1, 2}, {1, 0, 2, 3}, {1, 0, 3, 2}, {1, 2, 0, 3}, {1, 2, 3, 0},
            {1, 3, 2, 0}, {1, 3, 0, 2}, {2, 1, 0, 3}, {2, 1, 3, 0}, {2, 0, 1, 3},
            {2, 0, 3, 1}, {2, 3, 0, 1}, {2, 3, 1, 0}, {3, 1, 2, 0}, {3, 1, 0, 2},
            {3, 2, 1, 0}, {3, 2, 0, 1}, {3, 0, 2, 1}, {3, 0, 1, 2}};

        uint64_t sampleIndex = 0;
        bool pow2Samples = log2SamplesPerPixel & 1;
        int lastDigit = pow2Samples ? 1 : 0;
        for (int i = nBase4Digits - 1; i >= lastDigit; --i) {
            int digitShift = 2 * i;
            int digit = (mortonIndex >> digitShift) & 3;
            int p = HashPerm(mortonIndex >> (digitShift + 2));
            digit = permutations[p][digit];
            sampleIndex |= uint64_t(digit) << digitShift;
        }
        if (pow2Samples) {
            sampleIndex |= (mortonIndex & 3);
            sampleIndex >>= 1;
        }
        return sampleIndex;
    }